

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

uECC_word_t
uECC_vli_add(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  ulong uVar1;
  uECC_word_t sum;
  uECC_word_t uStack_30;
  wordcount_t i;
  uECC_word_t carry;
  wordcount_t num_words_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  uStack_30 = 0;
  for (sum._7_1_ = '\0'; sum._7_1_ < num_words; sum._7_1_ = sum._7_1_ + '\x01') {
    uVar1 = left[sum._7_1_] + right[sum._7_1_] + uStack_30;
    if (uVar1 != left[sum._7_1_]) {
      uStack_30 = (uECC_word_t)(int)(uint)(uVar1 < left[sum._7_1_]);
    }
    result[sum._7_1_] = uVar1;
  }
  return uStack_30;
}

Assistant:

uECC_VLI_API uECC_word_t uECC_vli_add(uECC_word_t *result,
                                      const uECC_word_t *left,
                                      const uECC_word_t *right,
                                      wordcount_t num_words) {
    uECC_word_t carry = 0;
    wordcount_t i;
    for (i = 0; i < num_words; ++i) {
        uECC_word_t sum = left[i] + right[i] + carry;
        if (sum != left[i]) {
            carry = (sum < left[i]);
        }
        result[i] = sum;
    }
    return carry;
}